

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_State_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Minefield_State_PDU::Minefield_State_PDU
          (Minefield_State_PDU *this,EntityIdentifier *ID,KUINT16 SequenceNumber,ForceID FID,
          EntityType *Type,WorldCoordinates *Loc,EulerAngles *Ori,MinefieldAppearance *MA,
          MinefieldProtocolMode MPM)

{
  KFLOAT64 KVar1;
  KUINT8 KVar2;
  KUINT16 KVar3;
  KUINT8 KVar4;
  KUINT8 KVar5;
  KUINT8 KVar6;
  KUINT8 KVar7;
  KFLOAT32 KVar8;
  
  Minefield_Header::Minefield_Header(&this->super_Minefield_Header);
  (this->super_Minefield_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Minefield_State_PDU_00334e38;
  this->m_ui8ForceID = (KUINT8)FID;
  this->m_ui8NumPerimPoints = '\0';
  (this->m_MinefieldType).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_003247b8;
  KVar2 = Type->m_ui8Domain;
  KVar3 = Type->m_ui16Country;
  KVar4 = Type->m_ui8Category;
  KVar5 = Type->m_ui8SubCategory;
  KVar6 = Type->m_ui8Specific;
  KVar7 = Type->m_ui8Extra;
  (this->m_MinefieldType).m_ui8EntityKind = Type->m_ui8EntityKind;
  (this->m_MinefieldType).m_ui8Domain = KVar2;
  (this->m_MinefieldType).m_ui16Country = KVar3;
  (this->m_MinefieldType).m_ui8Category = KVar4;
  (this->m_MinefieldType).m_ui8SubCategory = KVar5;
  (this->m_MinefieldType).m_ui8Specific = KVar6;
  (this->m_MinefieldType).m_ui8Extra = KVar7;
  this->m_ui16NumMineTypes = 0;
  (this->m_Loc).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00324d88;
  KVar1 = Loc->m_f64Y;
  (this->m_Loc).m_f64X = Loc->m_f64X;
  (this->m_Loc).m_f64Y = KVar1;
  (this->m_Loc).m_f64Z = Loc->m_f64Z;
  (this->m_Ori).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__EulerAngles_00324810;
  KVar8 = Ori->m_f32Theta;
  (this->m_Ori).m_f32Psi = Ori->m_f32Psi;
  (this->m_Ori).m_f32Theta = KVar8;
  (this->m_Ori).m_f32Phi = Ori->m_f32Phi;
  (this->m_App).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__MinefieldAppearance_003262f8;
  (this->m_App).m_ui16BitUnion = MA->m_ui16BitUnion;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vPoints).
  super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vMineTypes).
  super__Vector_base<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vMineTypes).
  super__Vector_base<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vMineTypes).
  super__Vector_base<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui8PDUType = '%';
  (this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength = 0x48;
  (this->m_SeqNumUnion).m_ui16SeqNum = SequenceNumber;
  (this->m_ui16ProtocolModeUnion).m_ui16ProtocolMode16 = (undefined2)MPM;
  KVar3 = (ID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->super_Minefield_Header).m_MinefieldID.super_SimulationIdentifier.m_ui16SiteID =
       (ID->super_SimulationIdentifier).m_ui16SiteID;
  (this->super_Minefield_Header).m_MinefieldID.super_SimulationIdentifier.m_ui16ApplicationID =
       KVar3;
  *(undefined2 *)&(this->super_Minefield_Header).m_MinefieldID.super_SimulationIdentifier.field_0xc
       = *(undefined2 *)&(ID->super_SimulationIdentifier).field_0xc;
  return;
}

Assistant:

Minefield_State_PDU::Minefield_State_PDU( const EntityIdentifier & ID, KUINT16 SequenceNumber, ForceID FID, const EntityType & Type,
        const WorldCoordinates & Loc, const EulerAngles & Ori, const MinefieldAppearance & MA,
        MinefieldProtocolMode MPM ) :
    m_ui8ForceID( FID ),
    m_ui8NumPerimPoints( 0 ),
    m_ui16NumMineTypes( 0 ),
    m_MinefieldType( Type ),
    m_Loc( Loc ),
    m_Ori( Ori ),
    m_App( MA )
{
    m_ui8PDUType = MinefieldState_PDU_Type;
    m_ui16PDULength = MINEFIELD_STATE_PDU_SIZE;
    m_SeqNumUnion.m_ui16SeqNum = SequenceNumber;
    m_ui16ProtocolModeUnion.m_ui16ProtocolMode16 = MPM;
    m_MinefieldID = ID;
}